

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

String * __thiscall
Json::OurReader::getFormattedErrorMessages_abi_cxx11_
          (String *__return_storage_ptr__,OurReader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  _Elt_pointer pEVar5;
  long *local_b8;
  long local_a8;
  long lStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  OurReader *local_70;
  String local_68;
  _Map_pointer local_48;
  _Elt_pointer local_40;
  _Elt_pointer local_38;
  
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pEVar5 = (this->errors_).
           super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_38 = (this->errors_).
             super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pEVar5 != local_38) {
    local_40 = (this->errors_).
               super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
    local_48 = (this->errors_).
               super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    paVar1 = &local_98.field_2;
    local_70 = this;
    do {
      getLocationLineAndColumn_abi_cxx11_(&local_68,local_70,(pEVar5->token_).start_);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x7a4615);
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_98.field_2._M_allocated_capacity = *psVar3;
        local_98.field_2._8_8_ = plVar2[3];
        local_98._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar3;
        local_98._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_98._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_98);
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_a8 = *plVar4;
        lStack_a0 = plVar2[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar4;
        local_b8 = (long *)*plVar2;
      }
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_98,"  ",&pEVar5->message_);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_98);
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_a8 = *plVar4;
        lStack_a0 = plVar2[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar4;
        local_b8 = (long *)*plVar2;
      }
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (pEVar5->extra_ != (Location)0x0) {
        getLocationLineAndColumn_abi_cxx11_(&local_68,local_70,pEVar5->extra_);
        plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x815692);
        psVar3 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar3) {
          local_98.field_2._M_allocated_capacity = *psVar3;
          local_98.field_2._8_8_ = plVar2[3];
          local_98._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_98.field_2._M_allocated_capacity = *psVar3;
          local_98._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_98._M_string_length = plVar2[1];
        *plVar2 = (long)psVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_98);
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_a8 = *plVar4;
          lStack_a0 = plVar2[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *plVar4;
          local_b8 = (long *)*plVar2;
        }
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8);
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      pEVar5 = pEVar5 + 1;
      if (pEVar5 == local_40) {
        pEVar5 = local_48[1];
        local_48 = local_48 + 1;
        local_40 = pEVar5 + 8;
      }
    } while (pEVar5 != local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

String OurReader::getFormattedErrorMessages() const {
  String formattedMessage;
  for (const auto& error : errors_) {
    formattedMessage +=
        "* " + getLocationLineAndColumn(error.token_.start_) + "\n";
    formattedMessage += "  " + error.message_ + "\n";
    if (error.extra_)
      formattedMessage +=
          "See " + getLocationLineAndColumn(error.extra_) + " for detail.\n";
  }
  return formattedMessage;
}